

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O1

void __thiscall NaControlLaw::Load(NaControlLaw *this,NaDataStream *ds)

{
  NaControlLawItems *this_00;
  NaControlLawSource NVar1;
  int iVar2;
  NaControlLawItem *this_01;
  undefined4 extraout_var;
  size_t sVar3;
  char *__dest;
  uint uVar4;
  int nItems;
  char szBuf [1024];
  int local_42c;
  char local_428 [1024];
  
  uVar4 = 0;
  NaDataStream::GetF(ds,"%s",local_428);
  NVar1 = StrToSourceIO(local_428);
  this->source = NVar1;
  NaDataStream::GetF(ds,"%u",&local_42c);
  this_00 = &this->items;
  NaDynAr<NaControlLawItem>::clean(this_00);
  if (0 < local_42c) {
    do {
      this_01 = (NaControlLawItem *)operator_new(0x40);
      NaControlLawItem::NaControlLawItem(this_01);
      NaDynAr<NaControlLawItem>::addh(this_00,this_01);
      iVar2 = (*this_00->_vptr_NaDynAr[0xf])(this_00,(ulong)uVar4);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
                ((long *)CONCAT44(extraout_var,iVar2),ds);
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < local_42c);
  }
  NaDataStream::GetF(ds,"%s",local_428);
  sVar3 = strlen(local_428);
  __dest = (char *)operator_new__(sVar3 + 1);
  this->filepath = __dest;
  strcpy(__dest,local_428);
  this->dataio = (NaDataFile *)0x0;
  NaDataStream::GetF(ds,"%lg",&this->start_value);
  NaLinearNoiseGen::Load(&this->lin_rand,ds);
  return;
}

Assistant:

void    NaControlLaw::Load (NaDataStream& ds)
{
    char    szBuf[1024];

    ds.GetF("%s", szBuf);
    source = StrToSourceIO(szBuf);

    // clsDescription
    int    nItems, i;
    ds.GetF("%u", &nItems);
    items.clean();
    for(i = 0; i < nItems; ++i){
        items.addh(new NaControlLawItem());
        items[i].Load(ds);
    }

    // clsFromFile
    ds.GetF("%s", szBuf);
    filepath = new char[strlen(szBuf) + 1];
    strcpy(filepath, szBuf);
    dataio = NULL;

    // clsManual
    ds.GetF("%lg", &start_value);

    // clsRandom
    lin_rand.Load(ds);
}